

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O1

void __thiscall WriterTest_WriteInt_Test::TestBody(WriterTest_WriteInt_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  *paVar2;
  bool bVar3;
  int iVar4;
  AssertionResult *pAVar5;
  int *in_RDX;
  int *value;
  uint *value_00;
  int *value_01;
  int *value_02;
  uint *value_03;
  char *pcVar6;
  pointer pcVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> expected;
  AssertionResult gtest_ar_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> actual;
  basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> os;
  basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_> writer;
  AssertionResult gtest_ar;
  AssertHelper local_a30 [2];
  undefined1 local_a20 [16];
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_a10;
  char *local_9f0;
  AssertionResult local_9e8;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_9d8;
  AssertionResult local_9b8;
  AssertionResult local_9a8 [7];
  ios_base local_938 [264];
  basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_> local_830;
  basic_buffer<wchar_t> local_820;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_800 [62];
  
  local_9a8[0]._0_4_ = 0x2a;
  (anonymous_namespace)::AnyWriteChecker::operator()(&local_820,&local_9a8[0].success_,in_RDX);
  if ((char)local_820._vptr_basic_buffer == '\0') {
    testing::Message::Message((Message *)local_9a8);
    if (local_820.ptr_ == (wchar_t *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)local_820.ptr_;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_a30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x269,pcVar6);
    testing::internal::AssertHelper::operator=(local_a30,(Message *)local_9a8);
    testing::internal::AssertHelper::~AssertHelper(local_a30);
    if ((AssertHelperData *)local_9a8[0]._0_8_ != (AssertHelperData *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
          local_9a8[0]._0_8_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_9a8[0]._0_8_ + 8))();
      }
      local_9a8[0]._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_820.ptr_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  local_9a8[0]._0_4_ = 0xffffffd6;
  (anonymous_namespace)::AnyWriteChecker::operator()(&local_820,&local_9a8[0].success_,value);
  if ((char)local_820._vptr_basic_buffer == '\0') {
    testing::Message::Message((Message *)local_9a8);
    if (local_820.ptr_ == (wchar_t *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)local_820.ptr_;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_a30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x26a,pcVar6);
    testing::internal::AssertHelper::operator=(local_a30,(Message *)local_9a8);
    testing::internal::AssertHelper::~AssertHelper(local_a30);
    if ((AssertHelperData *)local_9a8[0]._0_8_ != (AssertHelperData *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
          local_9a8[0]._0_8_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_9a8[0]._0_8_ + 8))();
      }
      local_9a8[0]._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_820.ptr_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  local_9f0 = (char *)((long)"invalid format specifier for char" + 0x1d);
  local_820.size_ = 0;
  local_820._vptr_basic_buffer = (_func_int **)&PTR_grow_002a8bf0;
  local_820.capacity_ = 500;
  local_830.locale_.locale_ = (void *)0x0;
  local_830.out_.container = &local_820;
  local_820.ptr_ = (wchar_t *)local_800;
  fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::
  write_decimal<int>((basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>
                      *)&local_830,0xc);
  paVar1 = &local_9d8.field_2;
  local_9d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_9d8,local_820.ptr_,
             (long)&((_Alloc_hider *)local_820.ptr_)->_M_p + local_820.size_);
  paVar2 = &local_a10.field_2;
  local_a10._M_string_length = 0;
  local_a10.field_2._M_local_buf[0] = local_a10.field_2._M_local_buf[0] & 0xffffff00;
  local_a10._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_9a8);
  std::ostream::operator<<(local_9a8,0xc);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_a10,(string *)local_a30);
  if (local_a30[0].data_ != (AssertHelperData *)local_a20) {
    operator_delete(local_a30[0].data_);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_9a8);
  std::ios_base::~ios_base(local_938);
  if (local_a10._M_string_length == local_9d8._M_string_length) {
    if ((pointer)local_a10._M_string_length != (pointer)0x0) {
      iVar4 = bcmp(local_a10._M_dataplus._M_p,local_9d8._M_dataplus._M_p,local_a10._M_string_length)
      ;
      if (iVar4 != 0) goto LAB_0011fc9a;
    }
    testing::AssertionSuccess();
  }
  else {
LAB_0011fc9a:
    testing::AssertionFailure();
    pAVar5 = testing::AssertionResult::operator<<(local_9a8,(char (*) [19])"Value of: (Writer<");
    pAVar5 = testing::AssertionResult::operator<<(pAVar5,&local_9f0);
    pAVar5 = testing::AssertionResult::operator<<(pAVar5,(char (*) [21])">() << value).str()\n");
    pAVar5 = testing::AssertionResult::operator<<(pAVar5,(char (*) [11])0x250069);
    pAVar5 = testing::AssertionResult::operator<<
                       (pAVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &local_9d8);
    pAVar5 = testing::AssertionResult::operator<<(pAVar5,(char (*) [2])0x250738);
    pAVar5 = testing::AssertionResult::operator<<(pAVar5,(char (*) [11])0x250075);
    pAVar5 = testing::AssertionResult::operator<<
                       (pAVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &local_a10);
    pAVar5 = testing::AssertionResult::operator<<(pAVar5,(char (*) [2])0x250738);
    testing::AssertionResult::AssertionResult(&local_9b8,pAVar5);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_9a8[0].message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_a10._M_dataplus._M_p != paVar2) {
    operator_delete(local_a10._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_9d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_9d8._M_dataplus._M_p);
  }
  local_820._vptr_basic_buffer = (_func_int **)&PTR_grow_002a8bf0;
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_820.ptr_ !=
      local_800) {
    operator_delete(local_820.ptr_);
  }
  if (local_9b8.success_ != true) {
    testing::AssertionResult::AssertionResult(&local_9e8,&local_9b8);
    goto LAB_0011ffd3;
  }
  local_9f0 = "wchar_t";
  local_820.size_ = 0;
  local_820._vptr_basic_buffer = (_func_int **)&PTR_grow_002a8d18;
  local_820.capacity_ = 500;
  local_830.locale_.locale_ = (void *)0x0;
  local_830.out_.container = &local_820;
  local_820.ptr_ = (wchar_t *)local_800;
  fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>::
  write_decimal<int>(&local_830,0xc);
  local_9d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>
            ((wstring *)&local_9d8,local_820.ptr_,
             (long)&((_Alloc_hider *)local_820.ptr_)->_M_p + local_820.size_ * 4);
  local_a10._M_string_length = 0;
  local_a10.field_2._M_local_buf[0] = L'\0';
  local_a10._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::wostringstream::wostringstream((wostringstream *)local_9a8);
  std::wostream::operator<<((wostream *)local_9a8,0xc);
  std::__cxx11::wstringbuf::str();
  std::__cxx11::wstring::operator=((wstring *)&local_a10,(wstring *)local_a30);
  if (local_a30[0].data_ != (AssertHelperData *)local_a20) {
    operator_delete(local_a30[0].data_);
  }
  std::__cxx11::wostringstream::~wostringstream((wostringstream *)local_9a8);
  std::ios_base::~ios_base(local_938);
  if (local_a10._M_string_length == local_9d8._M_string_length) {
    if ((pointer)local_a10._M_string_length != (pointer)0x0) {
      iVar4 = wmemcmp(local_a10._M_dataplus._M_p,local_9d8._M_dataplus._M_p,
                      local_a10._M_string_length);
      if (iVar4 != 0) goto LAB_0011fecc;
    }
    testing::AssertionSuccess();
  }
  else {
LAB_0011fecc:
    testing::AssertionFailure();
    pAVar5 = testing::AssertionResult::operator<<(local_9a8,(char (*) [19])"Value of: (Writer<");
    pAVar5 = testing::AssertionResult::operator<<(pAVar5,&local_9f0);
    pAVar5 = testing::AssertionResult::operator<<(pAVar5,(char (*) [21])">() << value).str()\n");
    pAVar5 = testing::AssertionResult::operator<<(pAVar5,(char (*) [11])0x250069);
    pAVar5 = testing::AssertionResult::operator<<(pAVar5,&local_9d8);
    pAVar5 = testing::AssertionResult::operator<<(pAVar5,(char (*) [2])0x250738);
    pAVar5 = testing::AssertionResult::operator<<(pAVar5,(char (*) [11])0x250075);
    pAVar5 = testing::AssertionResult::operator<<(pAVar5,&local_a10);
    pAVar5 = testing::AssertionResult::operator<<(pAVar5,(char (*) [2])0x250738);
    testing::AssertionResult::AssertionResult(&local_9e8,pAVar5);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_9a8[0].message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_a10._M_dataplus._M_p != paVar2) {
    operator_delete(local_a10._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_9d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_9d8._M_dataplus._M_p);
  }
  local_820._vptr_basic_buffer = (_func_int **)&PTR_grow_002a8d18;
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_820.ptr_ !=
      local_800) {
    operator_delete(local_820.ptr_);
  }
LAB_0011ffd3:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_9b8.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  if (local_9e8.success_ == false) {
    testing::Message::Message((Message *)&local_820);
    if (local_9e8.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((local_9e8.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_9a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x26b,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_9a8,(Message *)&local_820);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_9a8);
    if (local_820._vptr_basic_buffer != (_func_int **)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_820._vptr_basic_buffer != (_func_int **)0x0)) {
        (**(code **)(*local_820._vptr_basic_buffer + 8))();
      }
      local_820._vptr_basic_buffer = (_func_int **)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_9e8.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  local_9a8[0]._0_4_ = 0x22;
  (anonymous_namespace)::AnyWriteChecker::operator()(&local_820,&local_9a8[0].success_,value_00);
  if ((char)local_820._vptr_basic_buffer == '\0') {
    testing::Message::Message((Message *)local_9a8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_820.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((_Alloc_hider *)local_820.ptr_)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_a30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x26c,pcVar7);
    testing::internal::AssertHelper::operator=(local_a30,(Message *)local_9a8);
    testing::internal::AssertHelper::~AssertHelper(local_a30);
    if ((AssertHelperData *)local_9a8[0]._0_8_ != (AssertHelperData *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
          local_9a8[0]._0_8_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_9a8[0]._0_8_ + 8))();
      }
      local_9a8[0]._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_820.ptr_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  local_9a8[0]._0_4_ = 0x80000000;
  (anonymous_namespace)::AnyWriteChecker::operator()(&local_820,&local_9a8[0].success_,value_01);
  if ((char)local_820._vptr_basic_buffer == '\0') {
    testing::Message::Message((Message *)local_9a8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_820.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((_Alloc_hider *)local_820.ptr_)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_a30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x26d,pcVar7);
    testing::internal::AssertHelper::operator=(local_a30,(Message *)local_9a8);
    testing::internal::AssertHelper::~AssertHelper(local_a30);
    if ((AssertHelperData *)local_9a8[0]._0_8_ != (AssertHelperData *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
          local_9a8[0]._0_8_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_9a8[0]._0_8_ + 8))();
      }
      local_9a8[0]._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_820.ptr_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  local_9a8[0]._0_4_ = 0x7fffffff;
  (anonymous_namespace)::AnyWriteChecker::operator()(&local_820,&local_9a8[0].success_,value_02);
  if ((char)local_820._vptr_basic_buffer == '\0') {
    testing::Message::Message((Message *)local_9a8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_820.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((_Alloc_hider *)local_820.ptr_)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_a30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x26e,pcVar7);
    testing::internal::AssertHelper::operator=(local_a30,(Message *)local_9a8);
    testing::internal::AssertHelper::~AssertHelper(local_a30);
    if ((AssertHelperData *)local_9a8[0]._0_8_ != (AssertHelperData *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
          local_9a8[0]._0_8_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_9a8[0]._0_8_ + 8))();
      }
      local_9a8[0]._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_820.ptr_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  local_9a8[0]._0_4_ = 0xffffffff;
  (anonymous_namespace)::AnyWriteChecker::operator()(&local_820,&local_9a8[0].success_,value_03);
  if ((char)local_820._vptr_basic_buffer == '\0') {
    testing::Message::Message((Message *)local_9a8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_820.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((_Alloc_hider *)local_820.ptr_)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_a30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x26f,pcVar7);
    testing::internal::AssertHelper::operator=(local_a30,(Message *)local_9a8);
    testing::internal::AssertHelper::~AssertHelper(local_a30);
    if ((AssertHelperData *)local_9a8[0]._0_8_ != (AssertHelperData *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
          local_9a8[0]._0_8_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_9a8[0]._0_8_ + 8))();
      }
      local_9a8[0]._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_820.ptr_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  return;
}

Assistant:

TEST(WriterTest, WriteInt) {
  CHECK_WRITE(42);
  CHECK_WRITE(-42);
  CHECK_WRITE(static_cast<short>(12));
  CHECK_WRITE(34u);
  CHECK_WRITE(std::numeric_limits<int>::min());
  CHECK_WRITE(std::numeric_limits<int>::max());
  CHECK_WRITE(std::numeric_limits<unsigned>::max());
}